

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_DefinePropertyValueStr(JSContext *ctx,JSValue this_obj,char *prop,JSValue val,int flags)

{
  JSValue val_00;
  JSValue this_obj_00;
  int iVar1;
  JSContext *in_RCX;
  JSAtom unaff_retaddr;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  int ret;
  JSAtom atom;
  JSAtom in_stack_ffffffffffffffbc;
  JSContext *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  JS_NewAtom(in_RCX,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  this_obj_00.tag = (int64_t)val.u.ptr;
  this_obj_00.u.ptr = ctx;
  val_00.tag = (int64_t)prop;
  val_00.u.float64 = _ret;
  iVar1 = JS_DefinePropertyValue
                    ((JSContext *)CONCAT44(in_stack_0000000c,in_stack_00000008),this_obj_00,
                     unaff_retaddr,val_00,(int)this_obj.tag);
  JS_FreeAtom(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  return iVar1;
}

Assistant:

int JS_DefinePropertyValueStr(JSContext *ctx, JSValueConst this_obj,
                              const char *prop, JSValue val, int flags)
{
    JSAtom atom;
    int ret;
    atom = JS_NewAtom(ctx, prop);
    ret = JS_DefinePropertyValue(ctx, this_obj, atom, val, flags);
    JS_FreeAtom(ctx, atom);
    return ret;
}